

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.cpp
# Opt level: O3

void de::BlockBufferBasicTest::runTest(void)

{
  int j;
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  uint uVar5;
  Consumer *pCVar6;
  ulong uVar7;
  long *plVar8;
  uint uVar9;
  size_t __n;
  int iVar10;
  uint numProducers;
  long *plVar11;
  uint uVar12;
  undefined8 *puVar13;
  ulong uVar14;
  uint uVar15;
  undefined8 *puVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  vector<de::BlockBufferBasicTest::Consumer_*,_std::allocator<de::BlockBufferBasicTest::Consumer_*>_>
  consumers;
  vector<de::BlockBufferBasicTest::Producer_*,_std::allocator<de::BlockBufferBasicTest::Producer_*>_>
  producers;
  Message endMsg;
  Random rnd;
  MessageBuffer buffer;
  undefined1 local_e8 [16];
  long local_d8;
  undefined1 local_c8 [16];
  long local_b8;
  Consumer *local_a8;
  deUint32 local_9c;
  ulong local_98;
  deRandom local_90;
  BlockBuffer<de::BlockBufferBasicTest::Message> local_80;
  
  local_9c = 0;
  do {
    deRandom_init(&local_90,local_9c);
    dVar1 = deRandom_getUint32(&local_90);
    dVar2 = deRandom_getUint32(&local_90);
    dVar3 = deRandom_getUint32(&local_90);
    numProducers = (dVar3 & 0xf) + 1;
    dVar3 = deRandom_getUint32(&local_90);
    dVar4 = deRandom_getUint32(&local_90);
    local_98 = (ulong)(dVar4 % 0x97);
    __n = (size_t)((dVar4 / 0x97) * -0x97);
    BlockBuffer<de::BlockBufferBasicTest::Message>::BlockBuffer
              (&local_80,(dVar2 & 0xf) + 1,dVar1 % 0x7f + 2);
    local_b8 = 0;
    local_c8 = (undefined1  [16])0x0;
    local_d8 = 0;
    local_e8 = (undefined1  [16])0x0;
    uVar12 = 0;
    do {
      pCVar6 = (Consumer *)operator_new(0x28);
      Thread::Thread((Thread *)pCVar6);
      (pCVar6->super_Thread)._vptr_Thread = (_func_int **)&PTR__Thread_00274b08;
      pCVar6->m_buffer = &local_80;
      *(short *)&(pCVar6->m_lastPayload).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start = (short)uVar12;
      *(uint *)((long)&(pCVar6->m_lastPayload).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) = dVar4 % 0x97 + 0x32;
      local_a8 = pCVar6;
      std::
      vector<de::BlockBufferBasicTest::Producer*,std::allocator<de::BlockBufferBasicTest::Producer*>>
      ::emplace_back<de::BlockBufferBasicTest::Producer*>
                ((vector<de::BlockBufferBasicTest::Producer*,std::allocator<de::BlockBufferBasicTest::Producer*>>
                  *)local_c8,(Producer **)&local_a8);
      uVar12 = uVar12 + 1;
    } while (numProducers != uVar12);
    uVar15 = (dVar3 & 0xf) + 1;
    uVar12 = uVar15;
    do {
      pCVar6 = (Consumer *)operator_new(0x50);
      Consumer::Consumer(pCVar6,&local_80,numProducers);
      local_a8 = pCVar6;
      std::
      vector<de::BlockBufferBasicTest::Consumer*,std::allocator<de::BlockBufferBasicTest::Consumer*>>
      ::emplace_back<de::BlockBufferBasicTest::Consumer*>
                ((vector<de::BlockBufferBasicTest::Consumer*,std::allocator<de::BlockBufferBasicTest::Consumer*>>
                  *)local_e8,&local_a8);
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
    for (puVar16 = (undefined8 *)local_e8._0_8_; puVar16 != (undefined8 *)local_e8._8_8_;
        puVar16 = puVar16 + 1) {
      Thread::start((Thread *)*puVar16);
    }
    puVar16 = (undefined8 *)local_c8._0_8_;
    if (local_c8._0_8_ != local_c8._8_8_) {
      do {
        Thread::start((Thread *)*puVar16);
        puVar16 = puVar16 + 1;
      } while (puVar16 != (undefined8 *)local_c8._8_8_);
      puVar13 = (undefined8 *)local_c8._0_8_;
      if (puVar16 != (undefined8 *)local_c8._0_8_) {
        do {
          Thread::join((Thread *)*puVar13);
          puVar13 = puVar13 + 1;
        } while (puVar13 != (undefined8 *)local_c8._8_8_);
      }
    }
    local_a8 = (Consumer *)CONCAT44(local_a8._4_4_,0xffff0000);
    uVar12 = uVar15;
    do {
      BlockBuffer<de::BlockBufferBasicTest::Message>::write(&local_80,1,&local_a8,__n);
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
    BlockBuffer<de::BlockBufferBasicTest::Message>::flush(&local_80);
    for (puVar16 = (undefined8 *)local_e8._0_8_; puVar16 != (undefined8 *)local_e8._8_8_;
        puVar16 = puVar16 + 1) {
      Thread::join((Thread *)*puVar16);
    }
    uVar5 = (int)local_98 + 0x35U & 0x1fc;
    uVar9 = (int)local_98 + 0x31;
    uVar12 = 0;
    uVar17 = 1;
    uVar18 = 2;
    uVar19 = 3;
    uVar21 = 0;
    uVar23 = 0;
    uVar25 = 0;
    uVar27 = 0;
    do {
      uVar26 = uVar27;
      uVar24 = uVar25;
      uVar22 = uVar23;
      uVar20 = uVar21;
      uVar31 = uVar19;
      uVar30 = uVar18;
      uVar29 = uVar17;
      uVar28 = uVar12;
      uVar21 = (uVar28 & 0xffff) + uVar20;
      uVar23 = (uVar29 & 0xffff) + uVar22;
      uVar25 = (uVar30 & 0xffff) + uVar24;
      uVar27 = (uVar31 & 0xffff) + uVar26;
      uVar5 = uVar5 - 4;
      uVar12 = uVar28 + 4;
      uVar17 = uVar29 + 4;
      uVar18 = uVar30 + 4;
      uVar19 = uVar31 + 4;
    } while (uVar5 != 0);
    uVar12 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)(uVar28 ^ 0x80000000));
    uVar17 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)(uVar29 ^ 0x80000000));
    uVar18 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)(uVar30 ^ 0x80000000));
    uVar19 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)(uVar31 ^ 0x80000000));
    uVar14 = 0;
    do {
      uVar7 = 0;
      iVar10 = 0;
      do {
        iVar10 = iVar10 + *(int *)(*(long *)(*(long *)(local_e8._0_8_ + uVar7 * 8) + 0x38) +
                                  uVar14 * 4);
        uVar7 = uVar7 + 1;
      } while (uVar15 != uVar7);
      if ((~uVar19 & uVar27 | uVar26 & uVar19) + (~uVar17 & uVar23 | uVar22 & uVar17) +
          (~uVar18 & uVar25 | uVar24 & uVar18) + (~uVar12 & uVar21 | uVar20 & uVar12) != iVar10) {
        deAssertFail("refSum == cmpSum",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deBlockBuffer.cpp"
                     ,0xd4);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != numProducers);
    plVar8 = (long *)local_c8._8_8_;
    for (plVar11 = (long *)local_c8._0_8_; plVar11 != plVar8; plVar11 = plVar11 + 1) {
      if ((long *)*plVar11 != (long *)0x0) {
        (**(code **)(*(long *)*plVar11 + 8))();
        plVar8 = (long *)local_c8._8_8_;
      }
    }
    plVar8 = (long *)local_e8._8_8_;
    plVar11 = (long *)local_e8._0_8_;
    if (local_e8._0_8_ != local_e8._8_8_) {
      do {
        if ((long *)*plVar11 != (long *)0x0) {
          (**(code **)(*(long *)*plVar11 + 8))();
          plVar8 = (long *)local_e8._8_8_;
        }
        plVar11 = plVar11 + 1;
      } while (plVar11 != plVar8);
    }
    if ((long *)local_e8._0_8_ != (long *)0x0) {
      operator_delete((void *)local_e8._0_8_,local_d8 - local_e8._0_8_);
    }
    if ((void *)local_c8._0_8_ != (void *)0x0) {
      operator_delete((void *)local_c8._0_8_,local_b8 - local_c8._0_8_);
    }
    BlockBuffer<de::BlockBufferBasicTest::Message>::~BlockBuffer(&local_80);
    local_9c = local_9c + 1;
  } while (local_9c != 8);
  return;
}

Assistant:

void runTest (void)
{
	const int numIterations = 8;
	for (int iterNdx = 0; iterNdx < numIterations; iterNdx++)
	{
		Random							rnd				(iterNdx);
		int								numBlocks		= rnd.getInt(2, 128);
		int								blockSize		= rnd.getInt(1, 16);
		int								numProducers	= rnd.getInt(1, 16);
		int								numConsumers	= rnd.getInt(1, 16);
		int								dataSize		= rnd.getInt(50, 200);
		MessageBuffer					buffer			(blockSize, numBlocks);
		vector<Producer*>				producers;
		vector<Consumer*>				consumers;

		for (int i = 0; i < numProducers; i++)
			producers.push_back(new Producer(buffer, (deUint16)i, dataSize));

		for (int i = 0; i < numConsumers; i++)
			consumers.push_back(new Consumer(buffer, numProducers));

		// Start consumers.
		for (vector<Consumer*>::iterator i = consumers.begin(); i != consumers.end(); i++)
			(*i)->start();

		// Start producers.
		for (vector<Producer*>::iterator i = producers.begin(); i != producers.end(); i++)
			(*i)->start();

		// Wait for producers.
		for (vector<Producer*>::iterator i = producers.begin(); i != producers.end(); i++)
			(*i)->join();

		// Write end messages for consumers.
		const Message endMsg(0xffff, 0);
		for (int i = 0; i < numConsumers; i++)
			buffer.write(1, &endMsg);
		buffer.flush();

		// Wait for consumers.
		for (vector<Consumer*>::iterator i = consumers.begin(); i != consumers.end(); i++)
			(*i)->join();

		// Verify payload sums.
		deUint32 refSum = 0;
		for (int i = 0; i < dataSize; i++)
			refSum += (deUint32)(deUint16)i;

		for (int i = 0; i < numProducers; i++)
		{
			deUint32 cmpSum = 0;
			for (int j = 0; j < numConsumers; j++)
				cmpSum += consumers[j]->getPayloadSum((deUint16)i);
			DE_TEST_ASSERT(refSum == cmpSum);
		}

		// Free resources.
		for (vector<Producer*>::iterator i = producers.begin(); i != producers.end(); i++)
			delete *i;
		for (vector<Consumer*>::iterator i = consumers.begin(); i != consumers.end(); i++)
			delete *i;
	}
}